

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::Program::Program(Program *this,RegexFlags flags)

{
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  RegexFlags local_11;
  Program *pPStack_10;
  RegexFlags flags_local;
  Program *this_local;
  
  local_20 = (nullptr_t)0x0;
  local_11 = flags;
  pPStack_10 = this;
  Memory::WriteBarrierPtr<char16_t>::WriteBarrierPtr(&this->source,&local_20);
  this->sourceLen = 0;
  this->numGroups = 0;
  this->numLoops = 0;
  this->flags = local_11;
  RepType::RepType((RepType *)&(this->rep).insts);
  this->tag = InstructionsTag;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<unsigned_char>::operator=(&(this->rep).insts.insts,&local_28);
  (this->rep).insts.instsLen = 0;
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<char16_t>::operator=(&(this->rep).insts.litbuf,&local_30);
  (this->rep).insts.litbufLen = 0;
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<UnifiedRegex::ScannerInfo>_>::operator=
            (&(this->rep).insts.scannersForSyncToLiterals,&local_38);
  return;
}

Assistant:

Program::Program(RegexFlags flags)
        : source(nullptr)
        , sourceLen(0)
        , flags(flags)
        , numGroups(0)
        , numLoops(0)
    {
        tag = ProgramTag::InstructionsTag;
        rep.insts.insts = nullptr;
        rep.insts.instsLen = 0;
        rep.insts.litbuf = nullptr;
        rep.insts.litbufLen = 0;
        rep.insts.scannersForSyncToLiterals = nullptr;
    }